

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_dm.cxx
# Opt level: O3

void __thiscall xray_re::xr_dm::to_object(xr_dm *this,xr_sg_type sg_type)

{
  xr_mesh_builder *this_00;
  
  this_00 = (xr_mesh_builder *)operator_new(600);
  xr_mesh_builder::xr_mesh_builder(this_00,sg_type);
  xr_mesh_builder::prepare
            (this_00,5,(this->m_vb).super_xr_flexbuf.m_size,(this->m_ib).super_xr_flexbuf.m_size);
  xr_mesh_builder::push(this_00,&this->m_vb,&this->m_ib,0,0);
  xr_mesh_builder::compact_geometry(this_00);
  xr_mesh_builder::remove_duplicate_faces(this_00);
  xr_mesh_builder::remove_back_faces(this_00,1e-06);
  xr_mesh_builder::commit(this_00,&this->super_xr_object);
  std::__cxx11::string::_M_replace
            ((ulong)&(this_00->super_xr_mesh).m_name,0,
             (char *)(this_00->super_xr_mesh).m_name._M_string_length,0x1ec414);
  (*(this->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[6])(this);
  return;
}

Assistant:

void xr_dm::to_object(xr_sg_type sg_type)
{
	xr_mesh_builder* mesh = new xr_mesh_builder(sg_type);
	mesh->prepare(xr_vbuf::S_POINTS|xr_vbuf::S_TEXCOORDS, m_vb.size(), m_ib.size());
	mesh->push(m_vb, m_ib, 0, 0);
	mesh->compact_geometry();
	mesh->remove_duplicate_faces();
	mesh->remove_back_faces();
	mesh->commit(*this);
	mesh->name() = "detailShape";
	denominate_surfaces();
}